

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

ll_elem * succ(ll_head *q_head,ll_elem *n)

{
  int iVar1;
  ll_head *plVar2;
  ll_elem *plVar3;
  ll_elem *ss;
  ll_elem *s_;
  ll_elem *s;
  ll_elem *q;
  ll_elem *n_local;
  ll_head *q_head_local;
  
  s = &q_head->q;
  q = n;
  n_local = &q_head->q;
  plVar2 = (ll_head *)ptr_clear(&q_head->q);
  if (q_head != plVar2) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x10e,
                  "struct ll_elem *succ(struct ll_head *, struct ll_elem *)");
  }
  q = ptr_clear(q);
  if (q == (ll_elem *)0x0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x110,
                  "struct ll_elem *succ(struct ll_head *, struct ll_elem *)");
  }
  s_ = deref(&q->succ);
  plVar3 = ptr_clear(s_);
  if (plVar3 == (ll_elem *)0x0) {
    q_head_local = (ll_head *)s_;
  }
  else {
    while (iVar1 = deleted(s_), iVar1 != 0) {
      plVar3 = ptr_clear(s_);
      plVar3 = deref(&plVar3->succ);
      plVar3 = flag_combine(plVar3,s_);
      ss = s_;
      iVar1 = ptr_cas(&q->succ,&ss,plVar3);
      if (iVar1 == 0) {
        deref_release((ll_head *)n_local,s_,1);
        deref_release((ll_head *)n_local,plVar3,1);
        s_ = deref(&q->succ);
      }
      else {
        deref_acquire(plVar3,1);
        ptr_clear_deref(&q->succ);
        deref_release((ll_head *)n_local,s_,2);
        s_ = plVar3;
      }
    }
    q_head_local = (ll_head *)s_;
  }
  return &q_head_local->q;
}

Assistant:

static struct ll_elem*
succ(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *s, *s_, *ss;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	s = deref(&n->succ);
	/* If s is null, n is not on the queue. */
	if (ptr_clear(s) == NULL)
		return s;

	while (deleted(s)) {
		ss = flag_combine(deref(&ptr_clear(s)->succ), s);
		s_ = s;
		if (ptr_cas(&n->succ, &s_, ss)) {
			/* cas succeeded */
			deref_acquire(ss, 1);
			ptr_clear_deref(&n->succ);

			/* Release s:
			 * - once for n->succ
			 * - once because we no longer claim s.
			 */
			deref_release(q_head, s, 2);
			s = ss;
		} else {
			/* cas failed */
			deref_release(q_head, s, 1);
			deref_release(q_head, ss, 1);

			/*
			 * Cannot do s = s_, since we do not have the lock on
			 * n->succ at the moment and thus cannot acquire the
			 * reference counter on s_.
			 */
			s = deref(&n->succ);
		}
	}

	return s;
}